

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

void satoko_assump_pop(solver_t *s)

{
  uint uVar1;
  solver_t *s_local;
  
  uVar1 = vec_uint_size(s->assumptions);
  if (uVar1 != 0) {
    vec_uint_pop_back(s->assumptions);
    uVar1 = vec_uint_size(s->assumptions);
    solver_cancel_until(s,uVar1);
    return;
  }
  __assert_fail("vec_uint_size(s->assumptions) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver_api.c"
                ,0x134,"void satoko_assump_pop(solver_t *)");
}

Assistant:

void satoko_assump_pop(solver_t *s)
{
    assert(vec_uint_size(s->assumptions) > 0);
    // printf("[Satoko] Pop assumption: %d\n", vec_uint_pop_back(s->assumptions));
    vec_uint_pop_back(s->assumptions);
    solver_cancel_until(s, vec_uint_size(s->assumptions));
}